

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

int nni_setopt(nni_option *opts,char *nm,void *arg,void *buf,size_t sz,nni_type otype)

{
  int iVar1;
  nni_option *pnVar2;
  char *__s1;
  
  __s1 = opts->o_name;
  if (__s1 != (char *)0x0) {
    pnVar2 = opts + 1;
    do {
      iVar1 = strcmp(__s1,nm);
      if (iVar1 == 0) {
        if (pnVar2[-1].o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
          return 0x18;
        }
        iVar1 = (*pnVar2[-1].o_set)(arg,buf,sz,otype);
        return iVar1;
      }
      __s1 = pnVar2->o_name;
      pnVar2 = pnVar2 + 1;
    } while (__s1 != (char *)0x0);
  }
  return 9;
}

Assistant:

int
nni_setopt(const nni_option *opts, const char *nm, void *arg, const void *buf,
    size_t sz, nni_type otype)
{
	while (opts->o_name != NULL) {
		if (strcmp(opts->o_name, nm) == 0) {
			if (opts->o_set == NULL) {
				return (NNG_EREADONLY);
			}
			return (opts->o_set(arg, buf, sz, otype));
		}
		opts++;
	}
	return (NNG_ENOTSUP);
}